

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunnerTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_f6f12::FakeTestFixture::FakeTestFixture
          (FakeTestFixture *this,TestFixtureResults runResults)

{
  MockArgumentHandler<ut11::Category> *pMVar1;
  MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *pMVar2;
  
  (this->super_TestFixtureAbstract)._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__FakeTestFixture_0027d070;
  (this->m_runResults).ran = runResults.ran;
  (this->m_runResults).succeeded = runResults.succeeded;
  pMVar1 = &(this->mockAddCategory).m_argumentHandler;
  this->RunOutputUsed = (Output *)0x0;
  *(undefined8 *)&(this->mockAddCategory).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockAddCategory).m_callbackHandler.super__Function_base._M_functor + 8) = 0;
  (this->mockAddCategory).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockAddCategory).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<ut11::Category> **)
   ((long)&(this->mockAddCategory).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockAddCategory).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  (this->mockAddCategory).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>._M_impl
  ._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_functor
   + 8) = 0;
  (this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockAddCategory).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  ut11::
  Mock<std::set<ut11::Category,_std::less<ut11::Category>,_std::allocator<ut11::Category>_>_()>::
  Mock(&this->mockGetCategoriesConst);
  pMVar2 = &(this->mockGiven).m_argumentHandler;
  (this->mockGiven).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockGiven).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockGiven).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mockGiven).m_callbackHandler.super__Function_base._M_functor + 8) =
       0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockGiven).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar2;
  (this->mockGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar2;
  pMVar2 = &(this->mockWhen).m_argumentHandler;
  (this->mockGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockGiven).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockWhen).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mockWhen).m_callbackHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->mockWhen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockWhen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockWhen).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar2;
  (this->mockWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar2;
  pMVar2 = &(this->mockThen).m_argumentHandler;
  (this->mockWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockThen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  (this->mockWhen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockThen).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mockThen).m_callbackHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->mockThen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockThen).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar2;
  (this->mockThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar2;
  pMVar2 = &(this->mockFinally).m_argumentHandler;
  *(undefined8 *)((long)&(this->mockFinally).m_callbackHandler.super__Function_base._M_functor + 8)
       = 0;
  (this->mockFinally).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockThen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockFinally).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  (this->mockFinally).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockFinally).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar2;
  (this->mockFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar2;
  *(undefined8 *)
   ((long)&(this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8)
       = 0;
  (this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  (this->mockFinally).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  ut11::Mock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  Mock(&this->mockGetNameConst);
  return;
}

Assistant:

FakeTestFixture(ut11::detail::TestFixtureResults runResults)
			: m_runResults(runResults), RunOutputUsed(nullptr)
		{
		}